

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall ACSStringPool::AddString(ACSStringPool *this,char *str)

{
  DWORD h;
  uint uVar1;
  size_t len;
  BYTE *__s;
  FString fstr;
  FString local_30;
  
  __s = "";
  if (str != (char *)0x0) {
    __s = (BYTE *)str;
  }
  len = strlen((char *)__s);
  h = SuperFastHash((char *)__s,len);
  uVar1 = FindString(this,(char *)__s,len,h,h % 0xfb);
  if ((int)uVar1 < 0) {
    FString::FString(&local_30,(char *)__s);
    uVar1 = InsertString(this,&local_30,h,h % 0xfb);
    FString::~FString(&local_30);
  }
  else {
    uVar1 = uVar1 | 0x7ff00000;
  }
  return uVar1;
}

Assistant:

int ACSStringPool::AddString(const char *str)
{
	if (str == nullptr) str = "";
	size_t len = strlen(str);
	unsigned int h = SuperFastHash(str, len);
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, len, h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	FString fstr(str);
	return InsertString(fstr, h, bucketnum);
}